

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O0

void __thiscall
AwsCommandRunner_PreviousCommandFailed_Test::TestBody
          (AwsCommandRunner_PreviousCommandFailed_Test *this)

{
  bool bVar1;
  MockSpec<bool_()> *this_00;
  TypedExpectation<bool_()> *pTVar2;
  char *pcVar3;
  char *in_R9;
  string local_370;
  AssertHelper local_350;
  Message local_348;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__1;
  string local_320;
  AssertHelper local_300;
  Message local_2f8;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  undefined1 local_258 [8];
  AwsCommandRunner aws_command_runner;
  Action<bool_()> local_1d0;
  ReturnAction<bool> local_1c0;
  Action<bool_()> local_1b0 [2];
  undefined1 local_190 [8];
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  AwsCommandRunner_PreviousCommandFailed_Test *this_local;
  
  anon_unknown.dwarf_e710::MockCommandRunner::MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  MultipleCommandRunner::MultipleCommandRunner
            ((MultipleCommandRunner *)local_190,
             (CommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  this_00 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_PreviousCommandFailed
                      ((MockCommandRunner *)
                       &multiple_command_runner.ignore_failures_for_current_command_);
  pTVar2 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (this_00,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x2b,"command_runner","PreviousCommandFailed()");
  pTVar2 = testing::internal::TypedExpectation<bool_()>::Times(pTVar2,2);
  testing::Return<bool>((testing *)&local_1c0,false);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)local_1b0);
  pTVar2 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar2,local_1b0);
  testing::Return<bool>
            ((testing *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             true);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_1d0);
  testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar2,&local_1d0);
  testing::Action<bool_()>::~Action(&local_1d0);
  testing::internal::ReturnAction<bool>::~ReturnAction
            ((ReturnAction<bool> *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  testing::Action<bool_()>::~Action(local_1b0);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"/tmp/",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"unused",&local_2a1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&gtest_ar_.message_);
  AwsCommandRunner::AwsCommandRunner
            ((AwsCommandRunner *)local_258,(MultipleCommandRunner *)local_190,&local_278,&local_2a0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar_.message_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  bVar1 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_258);
  local_2e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_320,(internal *)local_2e8,
               (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    testing::Message::~Message(&local_2f8);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    local_339 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_258);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_338,&local_339,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
    if (!bVar1) {
      testing::Message::Message(&local_348);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_370,(internal *)local_338,
                 (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_350,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                 ,0x33,pcVar3);
      testing::internal::AssertHelper::operator=(&local_350,&local_348);
      testing::internal::AssertHelper::~AssertHelper(&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      testing::Message::~Message(&local_348);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      gtest_ar__1.message_.ptr_._4_4_ = 0;
    }
  }
  AwsCommandRunner::~AwsCommandRunner((AwsCommandRunner *)local_258);
  MultipleCommandRunner::~MultipleCommandRunner((MultipleCommandRunner *)local_190);
  anon_unknown.dwarf_e710::MockCommandRunner::~MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  return;
}

Assistant:

TEST(AwsCommandRunner, PreviousCommandFailed) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .Times(2)
      .WillOnce(Return(false))
      .WillOnce(Return(true));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "unused", {});
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_TRUE(aws_command_runner.PreviousCommandFailed());
}